

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

U64 ZSTD_ldm_fillLdmHashTable
              (ldmState_t *state,U64 lastHash,BYTE *lastHashed,BYTE *iend,BYTE *base,U32 hBits,
              ldmParams_t ldmParams)

{
  ldmParams_t ldmParams_00;
  ldmState_t *in_RCX;
  long in_RDX;
  U64 in_RSI;
  long in_RDI;
  U64 in_R8;
  U32 in_R9D;
  undefined8 unaff_retaddr;
  int in_stack_00000014;
  BYTE *cur;
  U64 rollingHash;
  ldmState_t *local_40;
  U64 local_38;
  U32 in_stack_ffffffffffffffd0;
  
  local_38 = in_RSI;
  for (local_40 = (ldmState_t *)(in_RDX + 1); local_40 < in_RCX;
      local_40 = (ldmState_t *)((long)&(local_40->window).nextSrc + 1)) {
    local_38 = ZSTD_ldm_updateHash(local_38,*(BYTE *)((long)&local_40[-1].hashPower + 7),
                                   *(BYTE *)((long)&(local_40->window).nextSrc +
                                            (ulong)(in_stack_00000014 - 1)),*(U64 *)(in_RDI + 0x30))
    ;
    ldmParams_00.bucketSizeLog = (int)in_RDI;
    ldmParams_00.minMatchLength = (int)((ulong)in_RDI >> 0x20);
    ldmParams_00.enableLdm = (int)in_RSI;
    ldmParams_00.hashLog = (int)(in_RSI >> 0x20);
    ldmParams_00._16_8_ = unaff_retaddr;
    ZSTD_ldm_makeEntryAndInsertByTag(in_RCX,in_R8,in_R9D,in_stack_ffffffffffffffd0,ldmParams_00);
  }
  return local_38;
}

Assistant:

static U64 ZSTD_ldm_fillLdmHashTable(ldmState_t* state,
                                     U64 lastHash, const BYTE* lastHashed,
                                     const BYTE* iend, const BYTE* base,
                                     U32 hBits, ldmParams_t const ldmParams)
{
    U64 rollingHash = lastHash;
    const BYTE* cur = lastHashed + 1;

    while (cur < iend) {
        rollingHash = ZSTD_ldm_updateHash(rollingHash, cur[-1],
                                          cur[ldmParams.minMatchLength-1],
                                          state->hashPower);
        ZSTD_ldm_makeEntryAndInsertByTag(state,
                                         rollingHash, hBits,
                                         (U32)(cur - base), ldmParams);
        ++cur;
    }
    return rollingHash;
}